

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_tools.cpp
# Opt level: O1

string * listThings(string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *things,bool articles)

{
  pointer pbVar1;
  pointer pbVar2;
  long lVar3;
  pointer pcVar4;
  long lVar5;
  long lVar6;
  stringstream ss;
  string local_228;
  long local_208;
  string local_200;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pbVar1 = (things->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (things->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2) {
    lVar5 = ((long)pbVar2 - (long)pbVar1 >> 5) + -1;
    local_208 = lVar5;
    local_1e0 = __return_storage_ptr__;
    if (lVar5 != 0) {
      lVar6 = 8;
      do {
        if (articles) {
          pbVar1 = (things->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          lVar3 = *(long *)((long)pbVar1 + lVar6 + -8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_200,lVar3,
                     *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6) + lVar3);
          getArticle(&local_228,&local_200);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
        }
        pbVar1 = (things->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,*(char **)((long)pbVar1 + lVar6 + -8),
                   *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6));
        if (0x40 < (ulong)((long)(things->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(things->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
        lVar6 = lVar6 + 0x20;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    __return_storage_ptr__ = local_1e0;
    lVar5 = local_208;
    if (0x20 < (ulong)((long)(things->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(things->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"and ",4);
    }
    if (articles) {
      pbVar1 = (things->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar4 = pbVar1[lVar5]._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar4,pcVar4 + pbVar1[lVar5]._M_string_length);
      getArticle(&local_228,&local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
    pbVar1 = (things->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,pbVar1[lVar5]._M_dataplus._M_p,pbVar1[lVar5]._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string listThings(std::vector<std::string> things, bool articles) {
  std::stringstream ss;

  if(!things.empty()) {
    size_t lastIndex = things.size() - 1;
    for(size_t i = 0; i < lastIndex; i++) {
      if(articles) { ss << getArticle(things[i]); }
      ss << things[i];
      if(things.size() > 2) { ss << ","; }
      ss << " ";
      //if(i < lastIndex) { ss << ", "; }
    }

    if(things.size() > 1) { ss << "and "; }
    if(articles) { ss << getArticle(things[lastIndex]); }
    ss << things[lastIndex];
  }

  return ss.str();
}